

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O1

error_t ArgumentHandlers::CE_parse_argument(int key,char *arg,argp_state *state)

{
  void *pvVar1;
  int iVar2;
  double dVar3;
  
  pvVar1 = state->input;
  if (key < 0x61) {
    if (key == 1) {
      iVar2 = atoi(arg);
      *(long *)((long)pvVar1 + 0x180) = (long)iVar2;
    }
    else if (key == 2) {
      iVar2 = atoi(arg);
      *(long *)((long)pvVar1 + 0x1b0) = (long)iVar2;
    }
    else {
      if (key != 0x4e) {
        return 7;
      }
      *(undefined1 *)((long)pvVar1 + 0x1a0) = 0;
    }
  }
  else if (key < 0x6e) {
    if (key == 0x61) {
      dVar3 = atof(arg);
      *(double *)((long)pvVar1 + 0x1a8) = dVar3;
    }
    else {
      if (key != 0x69) {
        return 7;
      }
      iVar2 = atoi(arg);
      *(long *)((long)pvVar1 + 0x188) = (long)iVar2;
    }
  }
  else if (key == 0x6e) {
    iVar2 = atoi(arg);
    *(long *)((long)pvVar1 + 400) = (long)iVar2;
  }
  else {
    if (key != 0x75) {
      return 7;
    }
    iVar2 = atoi(arg);
    *(long *)((long)pvVar1 + 0x198) = (long)iVar2;
  }
  return 0;
}

Assistant:

error_t
CE_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
    case CE_EVALUATION_RUNS:
        theArgumentsStruc->nrCEEvaluationRuns = atoi(arg);
        break;
    case CE_RESTARTS:
        theArgumentsStruc->nrCERestarts = atoi(arg);
        break;
    case 'i':
        theArgumentsStruc->nrCEIterations =  atoi(arg);
        break;
    case 'n':
        theArgumentsStruc->nrCESamples =  atoi(arg);
        break;
    case 'u':
        theArgumentsStruc->nrCESamplesForUpdate =  atoi(arg);
        break;
    case 'N':
        theArgumentsStruc->CE_use_hard_threshold = 0;
        break;
    case 'a':
        theArgumentsStruc->CE_alpha =  atof(arg);
        break;
    default:
        return ARGP_ERR_UNKNOWN;
    }
    return 0;
}